

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkRestrashRandom(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x8f,"Abc_Ntk_t *Abc_NtkRestrashRandom(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    puts("Warning: The choice nodes in the original AIG are removed by strashing.");
  }
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    Vec_IntFill(&pNtk->vTravIds,pNtk->vObjs->nSize + 500,0);
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,iVar1);
      Abc_NtkRestrashRandom_rec
                (pNtkNew,(Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
    }
    Abc_NtkFinalize(pNtk,pNtkNew);
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar3;
    }
    iVar1 = Abc_NtkCheck(pNtkNew);
    if (iVar1 == 0) {
      puts("Abc_NtkStrash: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkRestrashRandom_rec( pNtkAig, Abc_ObjFanin0(pObj) );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
    return pNtkAig;

}